

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

int32_t intersect_skewed_uint16_cardinality
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort *puVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  iVar2 = (int)size_l;
  if (size_s == 0) {
    return 0;
  }
  uVar8 = *small;
  iVar5 = iVar2 + -1;
  iVar1 = 0;
  iVar10 = 0;
  sVar6 = 0;
  puVar4 = large;
LAB_00104b3e:
  while (sVar7 = sVar6 + 1, uVar8 <= *puVar4) {
    sVar6 = sVar7;
    if (*puVar4 <= uVar8) {
      iVar1 = iVar1 + 1;
      if (size_s == sVar7) {
        return iVar1;
      }
      uVar8 = small[sVar7];
      iVar11 = iVar10 + 1;
      iVar12 = iVar11;
      if ((iVar2 <= iVar11) || (uVar8 <= large[iVar11])) goto LAB_00104c3a;
      iVar10 = iVar10 + 2;
      iVar3 = 0;
      iVar9 = iVar5;
      if (iVar2 <= iVar10) goto LAB_00104c14;
      iVar12 = 1;
      goto LAB_00104bf4;
    }
    if (size_s == sVar7) {
      return iVar1;
    }
    uVar8 = small[sVar7];
  }
  iVar12 = iVar10 + 1;
  iVar11 = iVar12;
  if ((iVar12 < iVar2) && (large[iVar12] < uVar8)) {
    iVar10 = iVar10 + 2;
    iVar3 = 0;
    iVar9 = iVar5;
    if (iVar10 < iVar2) {
      iVar11 = 1;
      do {
        iVar9 = iVar10;
        iVar3 = iVar11;
        if (uVar8 <= large[iVar10]) break;
        iVar3 = iVar11 * 2;
        iVar10 = iVar12 + iVar11 * 2;
        iVar9 = iVar5;
        iVar11 = iVar3;
      } while (iVar10 < iVar2);
      iVar3 = iVar3 >> 1;
    }
    iVar11 = iVar9;
    if (((large[iVar9] != uVar8) && (iVar11 = iVar2, uVar8 <= large[iVar9])) &&
       (iVar11 = iVar9, iVar3 + iVar12 + 1 != iVar9)) {
      iVar3 = iVar3 + iVar12;
      do {
        iVar11 = iVar3 + iVar9 >> 1;
        if (large[iVar11] == uVar8) break;
        iVar10 = iVar11;
        if (large[iVar11] < uVar8) {
          iVar10 = iVar9;
          iVar3 = iVar11;
        }
        iVar11 = iVar10;
        iVar9 = iVar10;
      } while (iVar3 + 1 != iVar10);
    }
  }
  iVar10 = iVar11;
  sVar7 = (size_t)iVar10;
  if (sVar7 == size_l) {
    return iVar1;
  }
  goto LAB_00104c46;
  while( true ) {
    iVar3 = iVar12 * 2;
    iVar10 = iVar11 + iVar12 * 2;
    iVar9 = iVar5;
    iVar12 = iVar3;
    if (iVar2 <= iVar10) break;
LAB_00104bf4:
    iVar9 = iVar10;
    iVar3 = iVar12;
    if (uVar8 <= large[iVar10]) break;
  }
  iVar3 = iVar3 >> 1;
LAB_00104c14:
  iVar12 = iVar9;
  if (((large[iVar9] != uVar8) && (iVar12 = iVar2, uVar8 <= large[iVar9])) &&
     (iVar12 = iVar9, iVar3 + iVar11 + 1 != iVar9)) {
    iVar3 = iVar3 + iVar11;
    do {
      iVar12 = iVar3 + iVar9 >> 1;
      if (large[iVar12] == uVar8) break;
      iVar10 = iVar12;
      if (large[iVar12] < uVar8) {
        iVar10 = iVar9;
        iVar3 = iVar12;
      }
      iVar12 = iVar10;
      iVar9 = iVar10;
    } while (iVar3 + 1 != iVar10);
  }
LAB_00104c3a:
  iVar10 = iVar12;
  sVar7 = (size_t)iVar10;
  if (sVar7 == size_l) {
    return iVar1;
  }
LAB_00104c46:
  puVar4 = large + sVar7;
  goto LAB_00104b3e;
}

Assistant:

int32_t intersect_skewed_uint16_cardinality(const uint16_t *small,
                                            size_t size_s,
                                            const uint16_t *large,
                                            size_t size_l) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            pos++;
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        }
    }

    return (int32_t)pos;
}